

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int mmi_rand_train(model_inventory_t *inv,model_def_t *mdef,lexicon_t *lex,vector_t **f,
                  s3lattice_t *lat,float64 a_beam,uint32 mean_reest,uint32 var_reest,feat_t *fcb)

{
  uint32 uVar1;
  s3lattice_t *psVar2;
  lexicon_t *plVar3;
  model_inventory_t *pmVar4;
  int iVar5;
  int32 iVar6;
  uint uVar7;
  time_t tVar8;
  acmod_id_t *l_phone;
  acmod_id_t *r_phone;
  state_t *psVar9;
  vector_t **feature;
  int iVar10;
  ulong uVar11;
  s3arc_s *psVar12;
  ulong uVar13;
  ulong uVar14;
  uint32 n_state;
  float64 log_lik;
  char nword [128];
  char pword [128];
  char cword [128];
  uint32 local_21c;
  vector_t **local_218;
  acmod_id_t *local_210;
  s3lattice_t *local_208;
  lexicon_t *local_200;
  uint32 local_1f4;
  vector_t **local_1f0;
  model_inventory_t *local_1e8;
  model_def_t *local_1e0;
  float64 local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  float64 local_1c0;
  char local_1b8 [128];
  char local_138 [128];
  char local_b8 [136];
  
  local_21c = 0;
  local_200 = lex;
  local_1f4 = mean_reest;
  local_1f0 = f;
  local_1e8 = inv;
  local_1e0 = mdef;
  local_1d8 = a_beam;
  printf(" %5u",(ulong)lat->n_arcs);
  local_208 = lat;
  if (lat->n_arcs != 0) {
    uVar14 = 0;
    do {
      iVar10 = lat->arc[uVar14].ef - lat->arc[uVar14].sf;
      uVar11 = (ulong)(iVar10 + 1);
      local_1d0 = uVar14;
      local_218 = (vector_t **)
                  __ckd_calloc__(uVar11,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                 ,0x45b);
      if (iVar10 != -1) {
        uVar13 = 0;
        do {
          local_218[uVar13] = local_1f0[(lat->arc[uVar14].sf + (int)uVar13) - 1];
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
      }
      iVar10 = lat->arc[uVar14].n_next_arcs * lat->arc[uVar14].n_prev_arcs;
      local_1c8 = uVar11;
      tVar8 = time((time_t *)0x0);
      srand((uint)tVar8);
      while ((iVar10 != 0 && (psVar12 = lat->arc, psVar12[uVar14].good_arc == 0))) {
        if (psVar12[uVar14].n_prev_arcs == 1) {
          uVar11 = 0;
        }
        else {
          iVar5 = rand();
          psVar12 = lat->arc;
          uVar11 = (long)((double)psVar12[uVar14].n_prev_arcs *
                         (double)iVar5 * 4.656612873077393e-10) & 0xffffffff;
        }
        local_210 = (acmod_id_t *)(ulong)psVar12[uVar14].prev_arcs[uVar11];
        if (psVar12[uVar14].n_next_arcs == 1) {
          uVar11 = 0;
        }
        else {
          iVar5 = rand();
          psVar12 = lat->arc;
          uVar11 = (long)((double)psVar12[uVar14].n_next_arcs *
                         (double)iVar5 * 4.656612873077393e-10) & 0xffffffff;
        }
        uVar1 = psVar12[uVar14].next_arcs[uVar11];
        strcpy(local_b8,psVar12[uVar14].word);
        if ((int)local_210 == 0) {
          builtin_strncpy(local_138,"<s>",4);
        }
        else {
          strcpy(local_138,psVar12[(int)local_210 - 1].word);
        }
        l_phone = mk_boundary_phone(local_138,0,local_200);
        if (uVar1 == 0) {
          builtin_strncpy(local_1b8,"</s>",5);
        }
        else {
          strcpy(local_1b8,lat->arc[uVar1 - 1].word);
        }
        plVar3 = local_200;
        r_phone = mk_boundary_phone(local_1b8,1,local_200);
        pmVar4 = local_1e8;
        psVar9 = next_utt_states_mmie
                           (&local_21c,plVar3,local_1e8,local_1e0,local_b8,l_phone,r_phone);
        iVar6 = mmi_viterbi_run(&local_1c0,local_218,(uint32)local_1c8,psVar9,local_21c,pmVar4,
                                local_1d8);
        if (iVar6 == 0) {
          psVar12 = local_208->arc;
          psVar12[uVar14].good_arc = 1;
          psVar12[uVar14].ac_score = local_1c0;
          psVar12[uVar14].best_prev_arc = (uint32)local_210;
          psVar12[uVar14].best_next_arc = uVar1;
        }
        ckd_free(l_phone);
        ckd_free(r_phone);
        iVar10 = iVar10 + -1;
        lat = local_208;
      }
      ckd_free(local_218);
      uVar11 = local_1d0 + 1;
      if (lat->arc[uVar14].good_arc == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x49e,"arc_%d is ignored (viterbi run failed)\n",uVar11 & 0xffffffff);
      }
      uVar14 = uVar11;
    } while (uVar11 < lat->n_arcs);
  }
  lat_fwd_bwd(lat);
  uVar7 = lat->n_arcs;
  if (uVar7 != 0) {
    uVar14 = 0;
    do {
      psVar12 = lat->arc;
      if (psVar12[uVar14].good_arc == 1) {
        iVar10 = psVar12[uVar14].ef - psVar12[uVar14].sf;
        uVar7 = iVar10 + 1;
        feature = (vector_t **)
                  __ckd_calloc__((ulong)uVar7,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                 ,0x4ad);
        if (iVar10 != -1) {
          uVar11 = 0;
          do {
            feature[uVar11] = local_1f0[(lat->arc[uVar14].sf + (int)uVar11) - 1];
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
        }
        psVar12 = lat->arc;
        uVar1 = psVar12[uVar14].best_prev_arc;
        local_218 = (vector_t **)(ulong)psVar12[uVar14].best_next_arc;
        strcpy(local_b8,psVar12[uVar14].word);
        if (uVar1 == 0) {
          builtin_strncpy(local_138,"<s>",4);
        }
        else {
          strcpy(local_138,psVar12[uVar1 - 1].word);
        }
        local_210 = mk_boundary_phone(local_138,0,local_200);
        psVar2 = local_208;
        if ((int)local_218 == 0) {
          builtin_strncpy(local_1b8,"</s>",5);
        }
        else {
          strcpy(local_1b8,local_208->arc[(int)local_218 - 1].word);
        }
        plVar3 = local_200;
        local_218 = (vector_t **)mk_boundary_phone(local_1b8,1,local_200);
        pmVar4 = local_1e8;
        psVar9 = next_utt_states_mmie
                           (&local_21c,plVar3,local_1e8,local_1e0,local_b8,local_210,
                            (acmod_id_t *)local_218);
        iVar6 = mmi_viterbi_update(feature,uVar7,psVar9,local_21c,pmVar4,local_1d8,local_1f4,
                                   var_reest,psVar2->arc[uVar14].gamma,fcb);
        if (iVar6 != 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                  ,0x4ce,"arc_%d is ignored (viterbi update failed)\n",(ulong)((int)uVar14 + 1));
        }
        ckd_free(feature);
        ckd_free(local_210);
        ckd_free(local_218);
        uVar7 = local_208->n_arcs;
        lat = local_208;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar7);
  }
  return 0;
}

Assistant:

int
mmi_rand_train(model_inventory_t *inv,
	       model_def_t *mdef,
	       lexicon_t *lex,
	       vector_t **f,
	       s3lattice_t *lat,
	       float64 a_beam,
	       uint32 mean_reest,
	       uint32 var_reest,
	       feat_t *fcb)
{
  uint32 k, n;
  uint32 n_rand;/* random number */
  uint32 n_max_run;/* the maximum number of viterbi run */
  char pword[128], cword[128], nword[128];      /* previous, current, next word */
  vector_t **arc_f = NULL;/* feature vector for a word arc */
  uint32 n_word_obs;/* frames of a word arc */
  uint32 rand_prev_id, rand_next_id;/* randomly selected previous and next arc id */
  uint32 *lphone, *rphone;        /* the last and first phone of previous and next word hypothesis */
  state_t *state_seq;/* HMM state sequence for an arc */
  uint32 n_state = 0;/* number of HMM states */
  float64 log_lik;/* log-likelihood of an arc */
  
  /* viterbi run on each arc */
  printf(" %5u", lat->n_arcs);
  
  for(n=0; n<lat->n_arcs; n++) {

    /* total observations of this arc */
    /* this is not very accurate, as it consumes one more frame for each word at the end */
    n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
    
    /* get the feature for this arc */
    arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
    for (k=0; k<n_word_obs; k++)
      arc_f[k] = f[k+lat->arc[n].sf-1];
    
    /* in case the viterbi run fails at a certain left and right context,
       at most randomly pick context n_prev_arcs * n_next_arcs times */
    n_max_run = lat->arc[n].n_prev_arcs * lat->arc[n].n_next_arcs;
    
    /* seed the random-number generator with current time */
    srand( (unsigned)time( NULL ) );
    
    /* randomly pick the left and right context */
    while (n_max_run > 0 && lat->arc[n].good_arc == 0) {
      
      /* get left arc id */
      if (lat->arc[n].n_prev_arcs == 1) {
	n_rand = 0;
      }
      else {
	n_rand = (uint32) (((double) rand() / (((double) RAND_MAX) + 1)) * lat->arc[n].n_prev_arcs );
      }
      rand_prev_id = lat->arc[n].prev_arcs[n_rand];

      /* get right arc id */
      if (lat->arc[n].n_next_arcs == 1) {
	n_rand = 0;
      }
      else {
	n_rand = (uint32) (((double) rand() / (((double) RAND_MAX) + 1)) * lat->arc[n].n_next_arcs );
      }
      rand_next_id = lat->arc[n].next_arcs[n_rand];
      
      /* get the triphone list */
      strcpy(cword, lat->arc[n].word);
      if (rand_prev_id == 0)
	strcpy(pword, "<s>");
      else
	strcpy(pword, lat->arc[rand_prev_id-1].word);
      lphone = mk_boundary_phone(pword, 0, lex);
      if (rand_next_id == 0)
	strcpy(nword, "</s>");
      else
	strcpy(nword, lat->arc[rand_next_id-1].word);
      rphone = mk_boundary_phone(nword, 1, lex);

      state_seq = next_utt_states_mmie(&n_state, lex, inv, mdef, cword, lphone, rphone);

      /* viterbi compuation to get the acoustic score for a word hypothesis */
      if (mmi_viterbi_run(&log_lik,
			  arc_f, n_word_obs,
			  state_seq, n_state,
			  inv,
			  a_beam) == S3_SUCCESS) {
	lat->arc[n].good_arc = 1;
	lat->arc[n].ac_score = log_lik;
	lat->arc[n].best_prev_arc = rand_prev_id;
	lat->arc[n].best_next_arc = rand_next_id;
      }

      n_max_run--;
      ckd_free(lphone);
      ckd_free(rphone);
    }
    
    ckd_free(arc_f);
    
    if (lat->arc[n].good_arc == 0) {
      E_INFO("arc_%d is ignored (viterbi run failed)\n", n+1);
    }
  }

  /* lattice-based forward-backward computation */
  lat_fwd_bwd(lat);

  /* update Gaussian parameters */
  for (n=0; n<lat->n_arcs; n++) {
    
    /* only if the arc was successful in viterbi run */
    if (lat->arc[n].good_arc == 1) {
      
      /* total observations of this arc */
      n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
      arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
      for (k=0; k<n_word_obs; k++)
	arc_f[k] = f[k+lat->arc[n].sf-1];
      
      /* get the randomly picked left and right context */
      rand_prev_id = lat->arc[n].best_prev_arc;
      rand_next_id = lat->arc[n].best_next_arc;
      
      /* get the triphone list */
      strcpy(cword, lat->arc[n].word);
      if (rand_prev_id == 0)
	strcpy(pword, "<s>");
      else
	strcpy(pword, lat->arc[rand_prev_id-1].word);
      lphone = mk_boundary_phone(pword, 0, lex);
      if (rand_next_id == 0)
	strcpy(nword, "</s>");
      else
	strcpy(nword, lat->arc[rand_next_id-1].word);
      rphone = mk_boundary_phone(nword, 1, lex);
      
      /* make state list */
      state_seq = next_utt_states_mmie(&n_state, lex, inv, mdef, cword, lphone, rphone);
      
      /* viterbi update model parameters */
      if (mmi_viterbi_update(arc_f, n_word_obs,
			     state_seq, n_state,
			     inv,
			     a_beam,
			     mean_reest,
			     var_reest,
			     lat->arc[n].gamma,
			     fcb) != S3_SUCCESS) {
	E_ERROR("arc_%d is ignored (viterbi update failed)\n", n+1);
      }
      ckd_free(arc_f);
      ckd_free(lphone);
      ckd_free(rphone);
    }
  }
  
  return S3_SUCCESS;
}